

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeChecker.cc
# Opt level: O2

void __thiscall mcc::TypeChecker::Visit(TypeChecker *this,While *while_stmt)

{
  element_type *peVar1;
  element_type *peVar2;
  ErrorReporter *this_00;
  bool bVar3;
  allocator<char> local_39;
  string local_38;
  
  peVar1 = (while_stmt->condition_).super___shared_ptr<mcc::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  (*peVar1->_vptr_Expr[2])(peVar1,this);
  bVar3 = IsIntegerType((while_stmt->condition_).
                        super___shared_ptr<mcc::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  if (!bVar3) {
    bVar3 = IsPointer((while_stmt->condition_).
                      super___shared_ptr<mcc::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    if (!bVar3) {
      this_00 = this->reporter_;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_38,"Used not-scalar where scalar is required",&local_39);
      ErrorReporter::Report(this_00,&local_38,&(while_stmt->super_Stmt).token_);
      std::__cxx11::string::~string((string *)&local_38);
      return;
    }
  }
  peVar2 = (while_stmt->loop_block_).super___shared_ptr<mcc::Stmt,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  (*peVar2->_vptr_Stmt[2])(peVar2,this);
  return;
}

Assistant:

void TypeChecker::Visit(While& while_stmt) {
  while_stmt.condition_->Accept(*this);

  if (!IsIntegerType(while_stmt.condition_.get()) && !IsPointer(while_stmt.condition_.get())) {
    reporter_.Report("Used not-scalar where scalar is required", while_stmt.token_);
    return;
  }

  while_stmt.loop_block_->Accept(*this);
}